

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<char>::clear(vec<char> *this,bool dealloc)

{
  if ((this->data != (char *)0x0) && (this->sz = 0, dealloc)) {
    this->cap = 0;
    free(this->data);
    this->data = (char *)0x0;
  }
  return;
}

Assistant:

void clear(bool dealloc = false) {
		if (!data) {
			return;
		}
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		sz = 0;
		if (dealloc) {
			cap = 0;
			free(data);
			data = nullptr;
		}
	}